

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

uint32_t __thiscall
ddd::DaTrie<true,_true,_false>::excheck_in_block_
          (DaTrie<true,_true,_false> *this,Edge *edge,uint32_t block_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint32_t uVar1;
  bool bVar2;
  uint uVar3;
  const_reference pvVar4;
  byte *pbVar5;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *in_RCX;
  uint in_EDX;
  Edge *in_RSI;
  DaTrie<true,_true,_false> *in_RDI;
  uint32_t unaff_retaddr;
  DaTrie<true,_true,_false> *in_stack_00000008;
  uint32_t base;
  uint32_t node_pos;
  uint32_t head;
  uint32_t local_30;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                     (in_RCX,(ulong)in_EDX);
  uVar1 = pvVar4->head;
  local_30 = uVar1;
  do {
    pbVar5 = Edge::begin(in_RSI);
    uVar3 = local_30 ^ *pbVar5;
    bVar2 = is_target_ex_(in_stack_00000008,unaff_retaddr,
                          (Edge *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (bVar2) {
      return uVar3;
    }
    local_30 = next_(in_RDI,local_30);
  } while (local_30 != uVar1);
  return 0xffffffff;
}

Assistant:

uint32_t excheck_in_block_(const Edge& edge, uint32_t block_pos,
                             const std::vector<BlockLink>& blocks) const {
    assert(0 < edge.size());

    auto head = blocks[block_pos].head;
    auto node_pos = head;

    do {
      auto base = node_pos ^*edge.begin();
      if (is_target_ex_(base, edge)) {
        return base;
      }
    } while ((node_pos = next_(node_pos)) != head);

    return NOT_FOUND;
  }